

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O1

int64_t __thiscall
cimod::BinaryPolynomialModel<int,_double>::GetVariablesToIntegers
          (BinaryPolynomialModel<int,_double> *this,int *index)

{
  int *piVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  int64_t iVar6;
  vector<int,_std::allocator<int>_> sorted_variables;
  vector<int,_std::allocator<int>_> local_30;
  
  sVar2 = std::
          _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)this,index);
  if (sVar2 == 0) {
    iVar6 = -1;
  }
  else {
    GetSortedVariables(&local_30,this);
    uVar3 = (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    piVar5 = local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (0 < (long)uVar3) {
      do {
        uVar4 = uVar3 >> 1;
        uVar3 = ~uVar4 + uVar3;
        piVar1 = piVar5 + uVar4 + 1;
        if (*index <= piVar5[uVar4]) {
          uVar3 = uVar4;
          piVar1 = piVar5;
        }
        piVar5 = piVar1;
      } while (0 < (long)uVar3);
    }
    if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar6 = (long)piVar5 -
            (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
  }
  return iVar6;
}

Assistant:

int64_t GetVariablesToIntegers( const IndexType &index ) const {
      if ( variables_.count( index ) == 0 ) {
        return -1;
      } else {
        std::vector<IndexType> sorted_variables = GetSortedVariables();
        return std::distance(
            sorted_variables.begin(), std::lower_bound( sorted_variables.begin(), sorted_variables.end(), index ) );
      }
    }